

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.h
# Opt level: O2

bool wasm::Match::Internal::
     Components<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_0,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
     ::match(matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_>
             candidate,
            SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
            *matchers)

{
  bool bVar1;
  
  bVar1 = Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
          ::matches(matchers->curr,candidate->left);
  if (bVar1) {
    bVar1 = Components<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_1,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
            ::match(candidate,&matchers->next);
    return bVar1;
  }
  return false;
}

Assistant:

static inline bool
  match(matched_t<Kind> candidate,
        SubMatchers<CurrMatcher, NextMatchers...>& matchers) {
    return matchers.curr.matches(GetComponent<Kind, pos>{}(candidate)) &&
           Components<Kind, pos + 1, NextMatchers...>::match(candidate,
                                                             matchers.next);
  }